

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O0

CreateAddressResponseStruct *
cfd::js::api::AddressApiBase::CreateAddress
          (CreateAddressResponseStruct *__return_storage_ptr__,CreateAddressRequestStruct *request,
          AddressFactory *address_factory)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  string local_508 [32];
  _Base_ptr local_4e8;
  undefined1 local_4e0;
  allocator local_4d1;
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  Address local_470 [376];
  Script local_2f8;
  Pubkey local_2c0;
  SchnorrPubkey local_2a8 [24];
  Pubkey local_290;
  AddressType local_274;
  undefined1 local_270 [4];
  AddressType addr_type;
  Script redeem_script;
  Script locking_script;
  Script script;
  Pubkey pubkey;
  Address local_1a0 [8];
  Address addr;
  AddressFactory *address_factory_local;
  CreateAddressRequestStruct *request_local;
  CreateAddressResponseStruct *response;
  
  CreateAddressResponseStruct::CreateAddressResponseStruct(__return_storage_ptr__);
  cfd::core::Address::Address(local_1a0);
  cfd::core::Pubkey::Pubkey((Pubkey *)&script.field_0x30);
  cfd::core::Script::Script((Script *)&locking_script.field_0x30);
  cfd::core::Script::Script((Script *)&redeem_script.field_0x30);
  cfd::core::Script::Script((Script *)local_270);
  local_274 = ConvertAddressType(&request->hash_type);
  bVar1 = std::operator==(&(request->key_data).type,"pubkey");
  if (bVar1) {
    if ((local_274 == kTaprootAddress) && (lVar3 = std::__cxx11::string::length(), lVar3 == 0x40)) {
      cfd::core::SchnorrPubkey::SchnorrPubkey(local_2a8,(string *)&request->key_data);
      cfd::core::SchnorrPubkey::CreatePubkey(SUB81(&local_290,0));
      core::Pubkey::operator=((Pubkey *)&script.field_0x30,&local_290);
      core::Pubkey::~Pubkey(&local_290);
      core::SchnorrPubkey::~SchnorrPubkey(local_2a8);
    }
    else {
      cfd::core::Pubkey::Pubkey(&local_2c0,(string *)&request->key_data);
      core::Pubkey::operator=((Pubkey *)&script.field_0x30,&local_2c0);
      core::Pubkey::~Pubkey(&local_2c0);
    }
  }
  else {
    bVar1 = std::operator==(&(request->key_data).type,"redeem_script");
    if (bVar1) {
      cfd::core::Script::Script(&local_2f8,(string *)&request->key_data);
      cfd::core::Script::operator=((Script *)&locking_script.field_0x30,&local_2f8);
      core::Script::~Script(&local_2f8);
    }
  }
  cfd::AddressFactory::CreateAddress
            ((AddressType)local_470,(Pubkey *)address_factory,(Script *)(ulong)local_274,
             (Script *)&script.field_0x30,(Script *)&locking_script.field_0x30);
  cfd::core::Address::operator=(local_1a0,local_470);
  core::Address::~Address(local_470);
  (__return_storage_ptr__->error).code = 0;
  cfd::core::Address::GetAddress_abi_cxx11_();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_490);
  std::__cxx11::string::~string(local_490);
  cfd::core::Script::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->locking_script,local_4b0);
  std::__cxx11::string::~string(local_4b0);
  bVar2 = cfd::core::Script::IsEmpty();
  if ((bVar2 & 1) == 0) {
    cfd::core::Script::GetHex_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->redeem_script,local_508);
    std::__cxx11::string::~string(local_508);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4d0,"redeemScript",&local_4d1);
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&__return_storage_ptr__->ignore_items,(value_type *)local_4d0);
    local_4e8 = (_Base_ptr)pVar4.first._M_node;
    local_4e0 = pVar4.second;
    std::__cxx11::string::~string(local_4d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  }
  core::Script::~Script((Script *)local_270);
  core::Script::~Script((Script *)&redeem_script.field_0x30);
  core::Script::~Script((Script *)&locking_script.field_0x30);
  core::Pubkey::~Pubkey((Pubkey *)&script.field_0x30);
  core::Address::~Address(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

CreateAddressResponseStruct AddressApiBase::CreateAddress(
    const CreateAddressRequestStruct& request,
    const AddressFactory* address_factory) {
  CreateAddressResponseStruct response;
  Address addr;
  Pubkey pubkey;
  Script script;
  Script locking_script;
  Script redeem_script;
  AddressType addr_type = ConvertAddressType(request.hash_type);

  if (request.key_data.type == "pubkey") {
    if ((addr_type == AddressType::kTaprootAddress) &&
        (request.key_data.hex.length() ==
         SchnorrPubkey::kSchnorrPubkeySize * 2)) {
      pubkey = SchnorrPubkey(request.key_data.hex).CreatePubkey();
    } else {
      pubkey = Pubkey(request.key_data.hex);
    }
  } else if (request.key_data.type == "redeem_script") {
    script = Script(request.key_data.hex);
  }

  addr = address_factory->CreateAddress(
      addr_type, &pubkey, &script, &locking_script, &redeem_script);

  response.error.code = 0;
  response.address = addr.GetAddress();
  response.locking_script = locking_script.GetHex();
  if (redeem_script.IsEmpty()) {
    response.ignore_items.insert("redeemScript");
  } else {
    response.redeem_script = redeem_script.GetHex();
  }
  return response;
}